

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  int iVar1;
  bool local_3d;
  int local_3c;
  undefined1 local_38 [4];
  int overflow;
  secp256k1_scalar term;
  uchar *tweak32_local;
  secp256k1_ge *p_local;
  
  local_3c = 0;
  term.d[3] = (uint64_t)tweak32;
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_38,tweak32,&local_3c);
  local_3d = false;
  if (local_3c == 0) {
    iVar1 = secp256k1_eckey_pubkey_tweak_add(p,(secp256k1_scalar *)local_38);
    local_3d = iVar1 != 0;
  }
  return (int)local_3d;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}